

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::smearScalar(Builder *this,Decoration precision,Id scalar,Id vectorType)

{
  bool bVar1;
  uint uVar2;
  Id IVar3;
  Id IVar4;
  Instruction *pIVar5;
  Op OVar6;
  uint uVar7;
  allocator_type local_59;
  Decoration local_58;
  Id scalar_local;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  
  scalar_local = scalar;
  uVar2 = getNumComponents(this,scalar);
  if (uVar2 != 1) {
    __assert_fail("getNumComponents(scalar) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbed,"Id spv::Builder::smearScalar(Decoration, Id, Id)");
  }
  pIVar5 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[scalar];
  if (pIVar5 == (Instruction *)0x0) {
    IVar4 = 0;
  }
  else {
    IVar4 = pIVar5->typeId;
  }
  IVar3 = getScalarTypeId(this,vectorType);
  if (IVar4 != IVar3) {
    __assert_fail("getTypeId(scalar) == getScalarTypeId(vectorType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbee,"Id spv::Builder::smearScalar(Decoration, Id, Id)");
  }
  uVar2 = getNumTypeConstituents(this,vectorType);
  if ((uVar2 == 1) &&
     ((this->module).idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[vectorType]->opCode != OpTypeCooperativeVectorNV)) {
    return scalar;
  }
  local_58 = precision;
  if (this->generatingOpCodeForSpecConst == true) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
               (long)(int)uVar2,&scalar_local,&local_59);
    bVar1 = isSpecConstant(this,scalar_local);
    IVar4 = makeCompositeConstant
                      (this,vectorType,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                       bVar1);
    pIVar5 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[IVar4];
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    goto LAB_003d7a4a;
  }
  if (this->useReplicatedComposites == false) {
    OVar6 = OpCompositeConstruct;
    if ((0 < (int)uVar2) &&
       ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_start[vectorType]->opCode == OpTypeCooperativeVectorNV))
    goto LAB_003d7989;
  }
  else if ((int)uVar2 < 1) {
    OVar6 = OpCompositeConstruct;
  }
  else {
LAB_003d7989:
    addCapability(this,CapabilityReplicatedCompositesEXT);
    addExtension(this,"SPV_EXT_replicated_composites");
    uVar2 = 1;
    OVar6 = OpCompositeConstructReplicateEXT;
  }
  pIVar5 = (Instruction *)::operator_new(0x60);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
  pIVar5->resultId = IVar4;
  pIVar5->typeId = vectorType;
  pIVar5->opCode = OVar6;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar5->block = (Block *)0x0;
  Instruction::reserveOperands(pIVar5,(long)(int)uVar2);
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = uVar2;
  }
  while (bVar1 = uVar7 != 0, uVar7 = uVar7 - 1, bVar1) {
    Instruction::addIdOperand(pIVar5,scalar);
  }
  local_50._M_head_impl = pIVar5;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
LAB_003d7a4a:
  IVar4 = setPrecision(this,pIVar5->resultId,local_58);
  return IVar4;
}

Assistant:

Id Builder::smearScalar(Decoration precision, Id scalar, Id vectorType)
{
    assert(getNumComponents(scalar) == 1);
    assert(getTypeId(scalar) == getScalarTypeId(vectorType));

    int numComponents = getNumTypeComponents(vectorType);
    if (numComponents == 1 && !isCooperativeVectorType(vectorType))
        return scalar;

    Instruction* smear = nullptr;
    if (generatingOpCodeForSpecConst) {
        auto members = std::vector<spv::Id>(numComponents, scalar);
        // Sometime even in spec-constant-op mode, the temporary vector created by
        // promoting a scalar might not be a spec constant. This should depend on
        // the scalar.
        // e.g.:
        //  const vec2 spec_const_result = a_spec_const_vec2 + a_front_end_const_scalar;
        // In such cases, the temporary vector created from a_front_end_const_scalar
        // is not a spec constant vector, even though the binary operation node is marked
        // as 'specConstant' and we are in spec-constant-op mode.
        auto result_id = makeCompositeConstant(vectorType, members, isSpecConstant(scalar));
        smear = module.getInstruction(result_id);
    } else {
        bool replicate = (useReplicatedComposites || isCooperativeVectorType(vectorType)) && (numComponents > 0);

        if (replicate) {
            numComponents = 1;
            addCapability(spv::CapabilityReplicatedCompositesEXT);
            addExtension(spv::E_SPV_EXT_replicated_composites);
        }

        Op opcode = replicate ? OpCompositeConstructReplicateEXT : OpCompositeConstruct;

        smear = new Instruction(getUniqueId(), vectorType, opcode);
        smear->reserveOperands(numComponents);
        for (int c = 0; c < numComponents; ++c)
            smear->addIdOperand(scalar);
        addInstruction(std::unique_ptr<Instruction>(smear));
    }

    return setPrecision(smear->getResultId(), precision);
}